

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderGetShaderivTest::iterate(GeometryShaderGetShaderivTest *this)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar5;
  MessageBuilder local_1b0;
  GLenum local_30 [2];
  GLint shader_type;
  byte local_19;
  long lStack_18;
  bool result;
  Functions *gl;
  GeometryShaderGetShaderivTest *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar1);
  local_19 = 1;
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0x1c5);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  GVar2 = (**(code **)(lStack_18 + 0x3f0))(0x8dd9);
  this->m_gs_id = GVar2;
  dVar3 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar3,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x1cb);
  local_30[0] = 0;
  (**(code **)(lStack_18 + 0xa70))(this->m_gs_id,0x8b4f,local_30);
  dVar3 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar3,"glGetShaderiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x1d1);
  if (local_30[0] != (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER) {
    this_01 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [22])"Invalid shader type [");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)local_30);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [33])"] reported for a Geometry Shader");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    local_19 = 0;
  }
  if ((local_19 & 1) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderGetShaderivTest::iterate()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Create a GS */
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	/* Check the type reported for the SO */
	glw::GLint shader_type = GL_NONE;

	gl.getShaderiv(m_gs_id, GL_SHADER_TYPE, &shader_type);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

	if ((glw::GLenum)shader_type != m_glExtTokens.GEOMETRY_SHADER)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid shader type [" << shader_type
						   << "] reported for a Geometry Shader" << tcu::TestLog::EndMessage;

		result = false;
	}

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}